

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_micro_batcher.hpp
# Opt level: O3

value_type * __thiscall
IntegratorXX::
SphericalMicroBatcher<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
::const_iterator::operator*(value_type *__return_storage_ptr__,const_iterator *this)

{
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  __first;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  p_batch_begin;
  unsigned_long *puVar1;
  array<double,_3UL> *paVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  p_batch_end;
  allocator_type local_9a;
  allocator_type local_99;
  pointer local_98;
  pointer paStack_90;
  pointer local_88;
  undefined8 local_78;
  pointer pdStack_70;
  pointer local_68;
  tuple<std::array<double,_3UL>,_std::array<double,_3UL>_> local_58;
  
  puVar1 = (this->idx_it)._M_current;
  paVar2 = (this->point_begin)._M_current;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  __first._M_current = paVar2 + uVar3;
  p_batch_begin._M_current = paVar2 + uVar4;
  p_batch_end._M_current = (array<double,_3UL> *)(this->weight_begin)._M_current;
  detail::
  get_box_bounds_points<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>>
            (&local_58,(detail *)__first._M_current,p_batch_begin,p_batch_end);
  std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
  vector<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,void>
            ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)&local_98,
             __first,p_batch_begin,&local_99);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_78,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             ((p_batch_end._M_current)->_M_elems + uVar3),
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             ((p_batch_end._M_current)->_M_elems + uVar4),&local_9a);
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
    ).
    super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
    .
    super__Tuple_impl<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
    .super__Tuple_impl<3UL,_std::vector<double,_std::allocator<double>_>_>.
    super__Head_base<3UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
    super__Vector_base<double,_std::allocator<double>_> = local_78;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).
           super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .
           super__Tuple_impl<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .super__Tuple_impl<3UL,_std::vector<double,_std::allocator<double>_>_>.
           super__Head_base<3UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
           super__Vector_base<double,_std::allocator<double>_> + 8) = pdStack_70;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).
           super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .
           super__Tuple_impl<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .super__Tuple_impl<3UL,_std::vector<double,_std::allocator<double>_>_>.
           super__Head_base<3UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
           super__Vector_base<double,_std::allocator<double>_> + 0x10) = local_68;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).
  super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .
  super__Tuple_impl<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .
  super__Head_base<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
  ._M_head_impl.
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = local_98;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).
           super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .
           super__Tuple_impl<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .
           super__Head_base<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
           ._M_head_impl.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl + 8) = paStack_90;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).
           super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .
           super__Tuple_impl<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           .
           super__Head_base<2UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
           ._M_head_impl.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl + 0x10) = local_88;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).
  super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .super__Head_base<1UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[0] =
       local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_3UL>_>.
       super__Head_base<1UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[0];
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).
  super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .super__Head_base<1UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[1] =
       local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_3UL>_>.
       super__Head_base<1UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[1];
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).
  super__Tuple_impl<1UL,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  .super__Head_base<1UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[2] =
       local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_3UL>_>.
       super__Head_base<1UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[2];
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[0] =
       local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
       super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[0];
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[1] =
       local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
       super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[1];
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ).super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[2] =
       local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
       super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl._M_elems[2];
  return __return_storage_ptr__;
}

Assistant:

value_type operator*() {

      auto [npts,pb,pe,wb,we] = range();
      auto [box_lo, box_up]   = detail::get_box_bounds_points(pb, pe);

      return std::make_tuple(
        box_lo,
        box_up,
        std::vector<point_type>( pb, pe ),
        std::vector<weight_type>( wb, we )
      );

    }